

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.tab.hh
# Opt level: O1

void __thiscall
tchecker::parsing::system::parser_t::
stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
::push(stack<tchecker::parsing::system::parser_t::stack_symbol_type,_std::vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>_>
       *this,stack_symbol_type *t)

{
  basic_symbol<tchecker::parsing::system::parser_t::by_state> local_98;
  
  local_98.super_by_state.state = '\0';
  local_98.value.field_0._0_8_ = 0;
  local_98.value.field_0._8_8_ = 0;
  local_98.value.field_0._16_8_ = 0;
  local_98.value.field_0._24_8_ = 0;
  local_98.value.field_0._32_8_ = 0;
  local_98.value.field_0._40_8_ = 0;
  local_98.value.field_0._48_8_ = 0;
  local_98.value.yytypeid_ = (type_info *)0x0;
  local_98.location.begin.filename = (filename_type *)0x0;
  local_98.location.begin.line = 1;
  local_98.location.begin.column = 1;
  local_98.location.end.filename = (filename_type *)0x0;
  local_98.location.end.line = 1;
  local_98.location.end.column = 1;
  std::
  vector<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>
  ::emplace_back<tchecker::parsing::system::parser_t::stack_symbol_type>
            (&this->seq_,(stack_symbol_type *)&local_98);
  basic_symbol<tchecker::parsing::system::parser_t::by_state>::~basic_symbol(&local_98);
  basic_symbol<tchecker::parsing::system::parser_t::by_state>::move
            (&(this->seq_).
              super__Vector_base<tchecker::parsing::system::parser_t::stack_symbol_type,_std::allocator<tchecker::parsing::system::parser_t::stack_symbol_type>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super_basic_symbol<tchecker::parsing::system::parser_t::by_state>,
             &t->super_basic_symbol<tchecker::parsing::system::parser_t::by_state>);
  return;
}

Assistant:

void
      push (YY_MOVE_REF (T) t)
      {
        seq_.push_back (T ());
        operator[] (0).move (t);
      }